

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Instruction * __thiscall spv::Builder::addInstruction(Builder *this,Op op)

{
  Block *pBVar1;
  Instruction *instruction;
  Instruction *raw_instruction;
  _Head_base<0UL,_spv::Instruction_*,_false> local_20;
  
  instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  instruction->resultId = 0;
  instruction->typeId = 0;
  instruction->opCode = op;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instruction->block = (Block *)0x0;
  pBVar1 = this->buildPoint;
  local_20._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar1->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_20);
  instruction->block = pBVar1;
  if (instruction->resultId != 0) {
    Module::mapInstruction(pBVar1->parent->parent,instruction);
  }
  if (local_20._M_head_impl != (Instruction *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Instruction[1])();
  }
  return instruction;
}

Assistant:

spv::Instruction *Builder::addInstruction(spv::Op op)
{
    auto inst = std::make_unique<spv::Instruction>(op);
    auto *ret = inst.get();
    getBuildPoint()->addInstruction(std::move(inst));
    return ret;
}